

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.c++
# Opt level: O1

ssize_t __thiscall
kj::GzipAsyncOutputStream::write(GzipAsyncOutputStream *this,int __fd,void *__buf,size_t __n)

{
  Coroutine<void> *this_00;
  PromiseAwaiter<void> *__return_storage_ptr__;
  GzipAsyncOutputStream *this_01;
  undefined4 uVar1;
  long lVar2;
  PromiseArenaMember *node;
  SourceLocation location;
  bool bVar3;
  coroutine_handle<void> coroutine;
  undefined4 in_register_00000034;
  
  coroutine._M_fr_ptr = operator_new(0x420);
  *(code **)coroutine._M_fr_ptr = write;
  *(code **)((long)coroutine._M_fr_ptr + 8) = write;
  this_00 = (Coroutine<void> *)((long)coroutine._M_fr_ptr + 0x10);
  *(size_t *)((long)coroutine._M_fr_ptr + 0x408) = __n;
  *(void **)((long)coroutine._M_fr_ptr + 0x400) = __buf;
  *(ulong *)((long)coroutine._M_fr_ptr + 0x3f8) = CONCAT44(in_register_00000034,__fd);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0062dd10;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0062dd58;
  location.function = "write";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/gzip.c++"
  ;
  location.lineNumber = 0xff;
  location.columnNumber = 0x26;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0062dd10;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0062dd58;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_AsyncOutputStream)._vptr_AsyncOutputStream = (_func_int **)this_00;
  if (__n != 0) {
    __return_storage_ptr__ = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x238);
    this_01 = (GzipAsyncOutputStream *)((long)coroutine._M_fr_ptr + 0x3f0);
    do {
      *(void **)((long)coroutine._M_fr_ptr + 0x410) = __buf;
      lVar2 = *(long *)((long)coroutine._M_fr_ptr + 0x3f8);
      uVar1 = *(undefined4 *)((long)__buf + 8);
      *(undefined8 *)(lVar2 + 0x18) = *__buf;
      *(undefined4 *)(lVar2 + 0x20) = uVar1;
      pump(this_01,(int)lVar2);
      co_await<void>(__return_storage_ptr__,(Promise<void> *)this_01);
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x418) = 0;
      bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
      if (bVar3) {
        return (ssize_t)this;
      }
      kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
      node = (PromiseArenaMember *)(this_01->super_AsyncOutputStream)._vptr_AsyncOutputStream;
      if (node != (PromiseArenaMember *)0x0) {
        (this_01->super_AsyncOutputStream)._vptr_AsyncOutputStream = (_func_int **)0x0;
        kj::_::PromiseDisposer::dispose(node);
      }
      __buf = (void *)(*(long *)((long)coroutine._M_fr_ptr + 0x410) + 0x10);
    } while ((undefined8 *)__buf !=
             (undefined8 *)
             (*(long *)((long)coroutine._M_fr_ptr + 0x408) * 0x10 +
             *(long *)((long)coroutine._M_fr_ptr + 0x400)));
  }
  kj::_::Coroutine<void>::fulfill(this_00,(FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x419));
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x418) = 1;
  return (ssize_t)this;
}

Assistant:

Promise<void> GzipAsyncOutputStream::write(ArrayPtr<const ArrayPtr<const byte>> pieces) {
  for (auto piece: pieces) co_await write(piece);
}